

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::EnumDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  EnumDescriptorProto *this;
  string *value;
  EnumDescriptorProto **v1;
  EnumDescriptorProto **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *other;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *this_01;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *other_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *other_01;
  uint32_t *puVar3;
  Arena *arena_00;
  EnumOptions *pEVar4;
  LogMessage local_a8;
  Voidify local_91;
  uint local_90;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  EnumDescriptorProto *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  EnumDescriptorProto *from;
  EnumDescriptorProto *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_28;
  string *local_20;
  EnumDescriptorProto *local_18;
  anon_union_104_1_493b367e_for_EnumDescriptorProto_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (EnumDescriptorProto *)to_msg;
  _this = (EnumDescriptorProto *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)MessageLite::GetArena(to_msg);
  local_68 = (EnumDescriptorProto *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::EnumDescriptorProto_const*>(&local_68);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::EnumDescriptorProto*>(&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::EnumDescriptorProto_const*,google::protobuf::EnumDescriptorProto*>
                       (v1,v2,"&from != _this");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x1a90,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  local_90 = 0;
  this_00 = _internal_mutable_value(from);
  other = _internal_value((EnumDescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::MergeFrom(this_00,other);
  this_01 = _internal_mutable_reserved_range(from);
  other_00 = _internal_reserved_range((EnumDescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::MergeFrom
            (this_01,other_00);
  this_02 = _internal_mutable_reserved_name_abi_cxx11_(from);
  other_01 = _internal_reserved_name_abi_cxx11_((EnumDescriptorProto *)arena);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(this_02,other_01);
  puVar3 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).field_0x10,0);
  this = from;
  local_90 = *puVar3;
  if ((local_90 & 7) != 0) {
    if ((local_90 & 1) != 0) {
      local_20 = _internal_name_abi_cxx11_((EnumDescriptorProto *)arena);
      local_18 = this;
      local_10 = &this->field_0;
      puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
      value = local_20;
      *puVar3 = *puVar3 | 1;
      arena_00 = MessageLite::GetArena((MessageLite *)this);
      internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,value,arena_00);
    }
    if ((local_90 & 2) != 0) {
      if ((arena->impl_).first_arena_.string_block_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1a9f,"from._impl_.options_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a8);
      }
      if ((from->field_0)._impl_.options_ == (EnumOptions *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.string_block_._M_b._M_p;
        local_28 = absl_log_internal_check_op_result;
        pEVar4 = (EnumOptions *)
                 Arena::CopyConstruct<google::protobuf::EnumOptions>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.options_ = pEVar4;
      }
      else {
        EnumOptions::MergeFrom
                  ((from->field_0)._impl_.options_,
                   (EnumOptions *)(arena->impl_).first_arena_.string_block_._M_b._M_p);
      }
    }
    if ((local_90 & 4) != 0) {
      (from->field_0)._impl_.visibility_ =
           (int)(arena->impl_).first_arena_.string_block_unused_.super___atomic_base<unsigned_long>.
                _M_i;
    }
  }
  uVar1 = local_90;
  puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void EnumDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumDescriptorProto*>(&to_msg);
  auto& from = static_cast<const EnumDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_value()->MergeFrom(
      from._internal_value());
  _this->_internal_mutable_reserved_range()->MergeFrom(
      from._internal_reserved_range());
  _this->_internal_mutable_reserved_name()->MergeFrom(from._internal_reserved_name());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.visibility_ = from._impl_.visibility_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}